

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::ProtectUnusablePages
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  undefined4 *puVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined8 in_RAX;
  ulong dwSize;
  undefined8 *in_FS_OFFSET;
  DWORD local_14 [2];
  DWORD oldProtect;
  
  local_14[0] = (DWORD)((ulong)in_RAX >> 0x20);
  uVar2 = 0x8000 % (uint)this->objectSize;
  if (0xfff < (ushort)uVar2) {
    dwSize = (ulong)(uVar2 & 0xf000);
    BVar5 = VirtualProtect((this->super_HeapBlock).address + (0x8000 - dwSize),dwSize,2,local_14);
    if ((BVar5 == 0) || (local_14[0] != 4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0xc3,"(ret && oldProtect == 0x04)","ret && oldProtect == PAGE_READWRITE");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
  }
  return;
}

Assistant:

void
SmallHeapBlockT<MediumAllocationBlockAttributes>::ProtectUnusablePages()
{
    size_t count = this->GetUnusablePageCount();
    if (count > 0)
    {
        char* startPage = this->address + (MediumAllocationBlockAttributes::PageCount - count) * AutoSystemInfo::PageSize;
        DWORD oldProtect;
        BOOL ret = ::VirtualProtect(startPage, count * AutoSystemInfo::PageSize, PAGE_READONLY, &oldProtect);
        Assert(ret && oldProtect == PAGE_READWRITE);
#ifdef RECYCLER_WRITE_WATCH
        if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
        {
            ::ResetWriteWatch(startPage, count*AutoSystemInfo::PageSize);
        }
#endif
    }
}